

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gptgen.cpp
# Opt level: O2

uint64_t get_capacity(string *drive)

{
  int __fd;
  int iVar1;
  uint64_t uVar2;
  uint64_t ret;
  uint64_t local_20;
  
  local_20 = 0;
  __fd = open((drive->_M_dataplus)._M_p,0);
  uVar2 = 0;
  if (__fd != 0) {
    iVar1 = ioctl(__fd,0x80081272,&local_20);
    close(__fd);
    uVar2 = 0;
    if (iVar1 == 0) {
      uVar2 = local_20;
    }
  }
  return uVar2;
}

Assistant:

uint64_t get_capacity(string drive)
{
#ifdef BLKGETSIZE64
	uint64_t ret = 0;
#elif MACOS_BUILD
	uint64_t ret = 0;
#else
	uint32_t ret = 0;
#endif
	int fin = open(drive.c_str(), O_RDONLY);
	if (!fin)
		return 0;

#ifdef BLKGETSIZE64
	if (ioctl(fin, BLKGETSIZE64, &ret)) {
		close(fin);
		return 0;
	}
#else
	if (ioctl(fin, BLKGETSIZE, &ret)) {
		close(fin);
		return 0;
	}
	ret *= 512;
#endif
	close(fin);

	return ret;
}